

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenSIMDTernary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef a,
                   BinaryenExpressionRef b,BinaryenExpressionRef c)

{
  SIMDTernary *pSVar1;
  Builder local_38;
  Expression *local_30;
  BinaryenExpressionRef c_local;
  BinaryenExpressionRef b_local;
  BinaryenExpressionRef a_local;
  BinaryenModuleRef pMStack_10;
  BinaryenOp op_local;
  BinaryenModuleRef module_local;
  
  local_30 = c;
  c_local = b;
  b_local = a;
  a_local._4_4_ = op;
  pMStack_10 = module;
  wasm::Builder::Builder(&local_38,module);
  pSVar1 = wasm::Builder::makeSIMDTernary(&local_38,a_local._4_4_,b_local,c_local,local_30);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDTernary(BinaryenModuleRef module,
                                          BinaryenOp op,
                                          BinaryenExpressionRef a,
                                          BinaryenExpressionRef b,
                                          BinaryenExpressionRef c) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDTernary(
        SIMDTernaryOp(op), (Expression*)a, (Expression*)b, (Expression*)c));
}